

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestJsonName_Test::TestBody
          (DescriptorPoolTypeResolverTest_TestJsonName_Test *this)

{
  TypeResolver *pTVar1;
  Field *pFVar2;
  Type *pTVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  AlphaNum *c;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  Metadata MVar4;
  string_view name;
  string_view name_00;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Type type;
  undefined1 local_160 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150 [2];
  internal local_130 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  undefined1 local_120 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  AlphaNum local_f0;
  undefined1 local_c0 [32];
  StatusRep *local_a0;
  Type local_98;
  
  Type::Type(&local_98,(Arena *)0x0);
  pTVar1 = (this->super_DescriptorPoolTypeResolverTest).resolver_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
           .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
  GetTypeUrl<proto2_unittest::TestAllTypes>();
  pTVar3 = &local_98;
  (*pTVar1->_vptr_TypeResolver[2])(&local_f0,pTVar1,local_160);
  local_120[0] = (internal)((StatusRep *)local_f0.piece_._M_len == (StatusRep *)0x1);
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_f0.piece_._M_len & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_f0.piece_._M_len);
  }
  if (local_160 != (undefined1  [8])local_150) {
    operator_delete((void *)local_160,local_150[0]._M_allocated_capacity + 1);
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_118;
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_160,(internal *)local_120,
               (AssertionResult *)
               "resolver_ ->ResolveMessageType( GetTypeUrl<proto2_unittest::TestAllTypes>(), &type) .ok()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x199,(char *)local_160);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if (local_160 != (undefined1  [8])local_150) {
      operator_delete((void *)local_160,local_150[0]._M_allocated_capacity + 1);
    }
    __ptr_00 = local_118;
    if ((StatusRep *)local_f0.piece_._M_len != (StatusRep *)0x0) {
      (**(code **)(*(long *)local_f0.piece_._M_len + 8))();
      __ptr_00 = local_118;
    }
LAB_00bd99c0:
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00bd9a29;
  }
  else {
    if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_118);
    }
    name._M_str = (char *)pTVar3;
    name._M_len = (size_t)"optional_int32";
    pFVar2 = FindField((anon_unknown_0 *)&local_98,(Type *)0xe,name);
    c = (AlphaNum *)
        ((ulong)(pFVar2->field_0)._impl_.json_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
              ((internal *)local_160,"\"optionalInt32\"",
               "FindField(type, \"optional_int32\")->json_name()",(char (*) [14])"optionalInt32",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)c);
    if (local_160[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_120);
      if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        c = (AlphaNum *)(anon_var_dwarf_a12c75 + 5);
      }
      else {
        c = (AlphaNum *)(local_158->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x19a,(char *)c);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
      if (local_120 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_120 + 8))();
      }
    }
    if (local_158 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_158,local_158);
    }
    pTVar1 = (this->super_DescriptorPoolTypeResolverTest).resolver_._M_t.
             super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
             .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
    MVar4 = proto3::TestCustomJsonName::GetMetadata
                      ((TestCustomJsonName *)proto3::_TestCustomJsonName_default_instance_);
    local_f0.piece_._M_str = ((MVar4.descriptor)->all_names_).payload_;
    local_f0.piece_._M_len = (size_t)*(ushort *)(local_f0.piece_._M_str + 2);
    local_f0.piece_._M_str = local_f0.piece_._M_str + ~local_f0.piece_._M_len;
    local_160 = (undefined1  [8])&DAT_00000013;
    local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1285da0;
    local_120 = (undefined1  [8])0x1;
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13ab429;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_c0,(lts_20250127 *)local_160,(AlphaNum *)local_120,&local_f0,c);
    pTVar3 = &local_98;
    (*pTVar1->_vptr_TypeResolver[2])(&local_a0,pTVar1,local_c0);
    local_130[0] = (internal)(local_a0 == (StatusRep *)0x1);
    local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (((ulong)local_a0 & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref(local_a0);
    }
    if ((AssertHelperData *)local_c0._0_8_ != (AssertHelperData *)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_128;
    if (local_130[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_160,local_130,
                 (AssertionResult *)
                 "resolver_ ->ResolveMessageType(GetTypeUrl<proto3::TestCustomJsonName>(), &type) .ok()"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x19f,(char *)local_160);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
      if (local_160 != (undefined1  [8])local_150) {
        operator_delete((void *)local_160,local_150[0]._M_allocated_capacity + 1);
      }
      __ptr_00 = local_128;
      if (local_120 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_120 + 8))();
        __ptr_00 = local_128;
      }
      goto LAB_00bd99c0;
    }
    if (local_128 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_128);
    }
    name_00._M_str = (char *)pTVar3;
    name_00._M_len = (size_t)"value";
    pFVar2 = FindField((anon_unknown_0 *)&local_98,(Type *)&DAT_00000005,name_00);
    testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
              ((internal *)local_160,"\"@value\"","FindField(type, \"value\")->json_name()",
               (char (*) [7])"@value",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)(pFVar2->field_0)._impl_.json_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
    if (local_160[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_120);
      if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = anon_var_dwarf_a12c75 + 5;
      }
      else {
        message = (local_158->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x1a0,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
      if (local_120 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_120 + 8))();
      }
    }
    if (local_158 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00bd9a29;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_158;
    __ptr_00 = local_158;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_00bd9a29:
  Type::~Type(&local_98);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestJsonName) {
  Type type;
  ASSERT_TRUE(resolver_
                  ->ResolveMessageType(
                      GetTypeUrl<proto2_unittest::TestAllTypes>(), &type)
                  .ok());
  EXPECT_EQ("optionalInt32", FindField(type, "optional_int32")->json_name());

  ASSERT_TRUE(
      resolver_
          ->ResolveMessageType(GetTypeUrl<proto3::TestCustomJsonName>(), &type)
          .ok());
  EXPECT_EQ("@value", FindField(type, "value")->json_name());
}